

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# forestdb.cc
# Opt level: O0

void fdb_fetch_header(uint64_t version,void *header_buf,bid_t *trie_root_bid,bid_t *seq_root_bid,
                     bid_t *stale_root_bid,uint64_t *ndocs,uint64_t *ndeletes,uint64_t *nlivenodes,
                     uint64_t *datasize,uint64_t *last_wal_flush_hdr_bid,uint64_t *kv_info_offset,
                     uint64_t *header_flags,char **new_filename,char **old_filename)

{
  bool bVar1;
  ushort uVar2;
  ushort uVar3;
  void *pvVar4;
  ulong *in_RCX;
  ulong *in_RDX;
  ulong *in_RSI;
  filemgr_magic_t in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  uint16_t old_filename_len;
  ulong *in_stack_00000008;
  uint16_t new_filename_len;
  size_t offset;
  long local_38;
  
  *in_RDX = *in_RSI;
  *in_RDX = *in_RDX >> 0x38 | (*in_RDX & 0xff000000000000) >> 0x28 |
            (*in_RDX & 0xff0000000000) >> 0x18 | (*in_RDX & 0xff00000000) >> 8 |
            (*in_RDX & 0xff000000) << 8 | (*in_RDX & 0xff0000) << 0x18 | (*in_RDX & 0xff00) << 0x28
            | *in_RDX << 0x38;
  *in_RCX = in_RSI[1];
  local_38 = 0x10;
  *in_RCX = *in_RCX >> 0x38 | (*in_RCX & 0xff000000000000) >> 0x28 |
            (*in_RCX & 0xff0000000000) >> 0x18 | (*in_RCX & 0xff00000000) >> 8 |
            (*in_RCX & 0xff000000) << 8 | (*in_RCX & 0xff0000) << 0x18 | (*in_RCX & 0xff00) << 0x28
            | *in_RCX << 0x38;
  bVar1 = ver_staletree_support(in_RDI);
  if (bVar1) {
    *in_R8 = in_RSI[2];
    local_38 = 0x18;
    *in_R8 = *in_R8 >> 0x38 | (*in_R8 & 0xff000000000000) >> 0x28 |
             (*in_R8 & 0xff0000000000) >> 0x18 | (*in_R8 & 0xff00000000) >> 8 |
             (*in_R8 & 0xff000000) << 8 | (*in_R8 & 0xff0000) << 0x18 | (*in_R8 & 0xff00) << 0x28 |
             *in_R8 << 0x38;
  }
  else {
    *in_R8 = 0xffffffffffffffff;
  }
  *in_R9 = *(ulong *)((long)in_RSI + local_38);
  *in_R9 = *in_R9 >> 0x38 | (*in_R9 & 0xff000000000000) >> 0x28 | (*in_R9 & 0xff0000000000) >> 0x18
           | (*in_R9 & 0xff00000000) >> 8 | (*in_R9 & 0xff000000) << 8 | (*in_R9 & 0xff0000) << 0x18
           | (*in_R9 & 0xff00) << 0x28 | *in_R9 << 0x38;
  bVar1 = ver_is_atleast_magic_001(in_RDI);
  if (bVar1) {
    *in_stack_00000008 = *(ulong *)((long)in_RSI + local_38 + 8);
    local_38 = local_38 + 0x10;
    *in_stack_00000008 =
         *in_stack_00000008 >> 0x38 | (*in_stack_00000008 & 0xff000000000000) >> 0x28 |
         (*in_stack_00000008 & 0xff0000000000) >> 0x18 | (*in_stack_00000008 & 0xff00000000) >> 8 |
         (*in_stack_00000008 & 0xff000000) << 8 | (*in_stack_00000008 & 0xff0000) << 0x18 |
         (*in_stack_00000008 & 0xff00) << 0x28 | *in_stack_00000008 << 0x38;
  }
  else {
    *in_stack_00000008 = 0;
    local_38 = local_38 + 8;
  }
  *(undefined8 *)offset = *(undefined8 *)((long)in_RSI + local_38);
  *(ulong *)offset =
       *(ulong *)offset >> 0x38 | (*(ulong *)offset & 0xff000000000000) >> 0x28 |
       (*(ulong *)offset & 0xff0000000000) >> 0x18 | (*(ulong *)offset & 0xff00000000) >> 8 |
       (*(ulong *)offset & 0xff000000) << 8 | (*(ulong *)offset & 0xff0000) << 0x18 |
       (*(ulong *)offset & 0xff00) << 0x28 | *(long *)offset << 0x38;
  *ndocs = *(uint64_t *)((long)in_RSI + local_38 + 8);
  *ndocs = *ndocs >> 0x38 | (*ndocs & 0xff000000000000) >> 0x28 | (*ndocs & 0xff0000000000) >> 0x18
           | (*ndocs & 0xff00000000) >> 8 | (*ndocs & 0xff000000) << 8 | (*ndocs & 0xff0000) << 0x18
           | (*ndocs & 0xff00) << 0x28 | *ndocs << 0x38;
  *stale_root_bid = *(bid_t *)((long)in_RSI + local_38 + 0x10);
  *stale_root_bid =
       *stale_root_bid >> 0x38 | (*stale_root_bid & 0xff000000000000) >> 0x28 |
       (*stale_root_bid & 0xff0000000000) >> 0x18 | (*stale_root_bid & 0xff00000000) >> 8 |
       (*stale_root_bid & 0xff000000) << 8 | (*stale_root_bid & 0xff0000) << 0x18 |
       (*stale_root_bid & 0xff00) << 0x28 | *stale_root_bid << 0x38;
  *seq_root_bid = *(bid_t *)((long)in_RSI + local_38 + 0x18);
  *seq_root_bid =
       *seq_root_bid >> 0x38 | (*seq_root_bid & 0xff000000000000) >> 0x28 |
       (*seq_root_bid & 0xff0000000000) >> 0x18 | (*seq_root_bid & 0xff00000000) >> 8 |
       (*seq_root_bid & 0xff000000) << 8 | (*seq_root_bid & 0xff0000) << 0x18 |
       (*seq_root_bid & 0xff00) << 0x28 | *seq_root_bid << 0x38;
  *trie_root_bid = *(bid_t *)((long)in_RSI + local_38 + 0x20);
  *trie_root_bid =
       *trie_root_bid >> 0x38 | (*trie_root_bid & 0xff000000000000) >> 0x28 |
       (*trie_root_bid & 0xff0000000000) >> 0x18 | (*trie_root_bid & 0xff00000000) >> 8 |
       (*trie_root_bid & 0xff000000) << 8 | (*trie_root_bid & 0xff0000) << 0x18 |
       (*trie_root_bid & 0xff00) << 0x28 | *trie_root_bid << 0x38;
  uVar3 = *(ushort *)((long)in_RSI + local_38 + 0x28);
  uVar2 = uVar3 >> 8 | uVar3 << 8;
  uVar3 = *(ushort *)((long)in_RSI + local_38 + 0x2a);
  uVar3 = uVar3 >> 8 | uVar3 << 8;
  if (uVar2 == 0) {
    *(undefined8 *)header_buf = 0;
  }
  else {
    *(long *)header_buf = (long)in_RSI + local_38 + 0x2c;
  }
  if ((version != 0) && (uVar3 != 0)) {
    pvVar4 = malloc((ulong)uVar3);
    *(void **)version = pvVar4;
    memcpy(*(void **)version,(void *)((long)in_RSI + (ulong)uVar2 + local_38 + 0x2c),(ulong)uVar3);
  }
  return;
}

Assistant:

void fdb_fetch_header(uint64_t version,
                      void *header_buf,
                      bid_t *trie_root_bid,
                      bid_t *seq_root_bid,
                      bid_t *stale_root_bid,
                      uint64_t *ndocs,
                      uint64_t *ndeletes,
                      uint64_t *nlivenodes,
                      uint64_t *datasize,
                      uint64_t *last_wal_flush_hdr_bid,
                      uint64_t *kv_info_offset,
                      uint64_t *header_flags,
                      char **new_filename,
                      char **old_filename)
{
    size_t offset = 0;
    uint16_t new_filename_len;
    uint16_t old_filename_len;

    seq_memcpy(trie_root_bid, (uint8_t *)header_buf + offset,
               sizeof(bid_t), offset);
    *trie_root_bid = _endian_decode(*trie_root_bid);

    seq_memcpy(seq_root_bid, (uint8_t *)header_buf + offset,
               sizeof(bid_t), offset);
    *seq_root_bid = _endian_decode(*seq_root_bid);

    if (ver_staletree_support(version)) {
        seq_memcpy(stale_root_bid, (uint8_t *)header_buf + offset,
                   sizeof(bid_t), offset);
        *stale_root_bid = _endian_decode(*stale_root_bid);
    } else {
        *stale_root_bid = BLK_NOT_FOUND;
    }

    seq_memcpy(ndocs, (uint8_t *)header_buf + offset,
               sizeof(uint64_t), offset);
    *ndocs = _endian_decode(*ndocs);
    if (ver_is_atleast_magic_001(version)) {
        seq_memcpy(ndeletes, (uint8_t *)header_buf + offset,
                   sizeof(uint64_t), offset);
        *ndeletes = _endian_decode(*ndeletes);
    } else {
        *ndeletes = 0;
    }

    seq_memcpy(nlivenodes, (uint8_t *)header_buf + offset,
               sizeof(uint64_t), offset);
    *nlivenodes = _endian_decode(*nlivenodes);

    seq_memcpy(datasize, (uint8_t *)header_buf + offset,
               sizeof(uint64_t), offset);
    *datasize = _endian_decode(*datasize);

    seq_memcpy(last_wal_flush_hdr_bid, (uint8_t *)header_buf + offset,
               sizeof(uint64_t), offset);
    *last_wal_flush_hdr_bid = _endian_decode(*last_wal_flush_hdr_bid);

    seq_memcpy(kv_info_offset, (uint8_t *)header_buf + offset,
               sizeof(uint64_t), offset);
    *kv_info_offset = _endian_decode(*kv_info_offset);

    seq_memcpy(header_flags, (uint8_t *)header_buf + offset,
               sizeof(uint64_t), offset);
    *header_flags = _endian_decode(*header_flags);

    seq_memcpy(&new_filename_len, (uint8_t *)header_buf + offset,
               sizeof(new_filename_len), offset);
    new_filename_len = _endian_decode(new_filename_len);
    seq_memcpy(&old_filename_len, (uint8_t *)header_buf + offset,
               sizeof(old_filename_len), offset);
    old_filename_len = _endian_decode(old_filename_len);
    if (new_filename_len) {
        *new_filename = (char*)((uint8_t *)header_buf + offset);
    } else {
        *new_filename = NULL;
    }
    offset += new_filename_len;
    if (old_filename && old_filename_len) {
        *old_filename = (char *) malloc(old_filename_len);
        seq_memcpy(*old_filename,
                   (uint8_t *)header_buf + offset,
                   old_filename_len, offset);
    }
}